

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

void __thiscall TcpServer::TcpServer(TcpServer *this,EventLoop *loop,char *ip,uint16_t port)

{
  __sighandler_t p_Var1;
  TcpServer *local_50;
  unique_ptr<Acceptor,_std::default_delete<Acceptor>_> local_48;
  anon_class_8_1_8991fb9c local_40 [3];
  uint16_t local_22;
  char *pcStack_20;
  uint16_t port_local;
  char *ip_local;
  EventLoop *loop_local;
  TcpServer *this_local;
  
  local_22 = port;
  pcStack_20 = ip;
  ip_local = (char *)loop;
  loop_local = (EventLoop *)this;
  std::unique_ptr<Acceptor,std::default_delete<Acceptor>>::
  unique_ptr<std::default_delete<Acceptor>,void>
            ((unique_ptr<Acceptor,std::default_delete<Acceptor>> *)&this->ts_acceptor);
  std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::vector(&this->ts_conn_loops);
  std::unique_ptr<Threadpool,std::default_delete<Threadpool>>::
  unique_ptr<std::default_delete<Threadpool>,void>
            ((unique_ptr<Threadpool,std::default_delete<Threadpool>> *)&this->ts_thread_pool);
  this->ts_thread_num = 1;
  this->ts_next_loop = -1;
  Timer::Timer(&this->ts_timer);
  this->ts_tcp_conn_timout_ms = 6000;
  std::mutex::mutex(&this->ts_mutex);
  std::vector<std::shared_ptr<TcpConnection>,_std::allocator<std::shared_ptr<TcpConnection>_>_>::
  vector(&this->ts_tcp_connections);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::function(&this->ts_connected_cb);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::function
            (&this->ts_msg_cb);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::function
            (&this->ts_message_cb);
  std::function<void_()>::function(&this->ts_close_cb);
  p_Var1 = signal(1,(__sighandler_t)0x1);
  if ((p_Var1 == (__sighandler_t)0xffffffffffffffff) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] ignore SIGHUP signal error\n","error","TcpServer",0xf);
  }
  p_Var1 = signal(0xd,(__sighandler_t)0x1);
  if ((p_Var1 == (__sighandler_t)0xffffffffffffffff) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] ignore SIGPIPE signal error\n","error","TcpServer",0x12);
  }
  this->ts_acceptor_loop = (EventLoop *)ip_local;
  this->ip = pcStack_20;
  this->port = local_22;
  local_40[0].this = this;
  std::function<void(std::shared_ptr<TcpConnection>const&,InputBuffer*)>::operator=
            ((function<void(std::shared_ptr<TcpConnection>const&,InputBuffer*)> *)
             &this->ts_message_cb,local_40);
  local_50 = this;
  std::make_unique<Acceptor,TcpServer*,EventLoop*&,char_const*&,unsigned_short&>
            ((TcpServer **)&local_48,(EventLoop **)&local_50,&ip_local,
             (unsigned_short *)&stack0xffffffffffffffe0);
  std::unique_ptr<Acceptor,_std::default_delete<Acceptor>_>::operator=(&this->ts_acceptor,&local_48)
  ;
  std::unique_ptr<Acceptor,_std::default_delete<Acceptor>_>::~unique_ptr(&local_48);
  return;
}

Assistant:

TcpServer::TcpServer(EventLoop* loop, const char *ip, uint16_t port) {    

    if (signal(SIGHUP, SIG_IGN) == SIG_ERR) {       // SIGHUP: when terminal closing
        PR_ERROR("ignore SIGHUP signal error\n");
    }
    if (signal(SIGPIPE, SIG_IGN) == SIG_ERR) {     // SIGPIPE: write a closed client
        PR_ERROR("ignore SIGPIPE signal error\n");
    }

    ts_acceptor_loop = loop;
    this->ip = ip;
    this->port = port;
    ts_message_cb = [this](const TcpConnSP& conn, InputBuffer* ibuf) {
                        update_conn_timeout_time(conn);
                        if(ts_msg_cb)
                        {
                            ts_msg_cb(conn, ibuf);
                        }
                    };
    ts_acceptor = make_unique<Acceptor>(this, loop, ip, port);
}